

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  undefined8 uVar1;
  uint uVar2;
  void *pvVar3;
  U32 *pUVar4;
  size_t code;
  long lVar5;
  long lVar6;
  ZSTD_CCtx_params params;
  ZSTD_CCtx_params local_a8;
  
  uVar1 = cParams._20_8_;
  (cdict->cParams).searchLog = (int)cParams._12_8_;
  (cdict->cParams).searchLength = (int)((ulong)cParams._12_8_ >> 0x20);
  (cdict->cParams).targetLength = (uint)uVar1;
  (cdict->cParams).strategy = SUB84(uVar1,4);
  (cdict->cParams).windowLog = (int)cParams._0_8_;
  (cdict->cParams).chainLog = (int)((ulong)cParams._0_8_ >> 0x20);
  (cdict->cParams).hashLog = (int)cParams._8_8_;
  (cdict->cParams).searchLog = (int)((ulong)cParams._8_8_ >> 0x20);
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictBuffer = (void *)0x0;
    cdict->dictContent = dictBuffer;
  }
  else {
    pvVar3 = ZSTD_malloc(dictSize,cdict->customMem);
    cdict->dictBuffer = pvVar3;
    cdict->dictContent = pvVar3;
    if (pvVar3 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    memcpy(pvVar3,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  (cdict->cBlockState).rep[0] = 1;
  (cdict->cBlockState).rep[1] = 4;
  (cdict->cBlockState).rep[2] = 8;
  (cdict->cBlockState).entropy.hufCTable_repeatMode = HUF_repeat_none;
  (cdict->cBlockState).entropy.offcode_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.matchlength_repeatMode = FSE_repeat_none;
  (cdict->cBlockState).entropy.litlength_repeatMode = FSE_repeat_none;
  pvVar3 = cdict->workspace;
  pUVar4 = (U32 *)((long)pvVar3 + 0x1800);
  lVar5 = 0;
  if (cParams.strategy != ZSTD_fast) {
    lVar5 = 1L << ((byte)cParams.chainLog & 0x3f);
  }
  lVar6 = 1L << ((byte)cParams.hashLog & 0x3f);
  (cdict->matchState).hashLog3 = 0;
  (cdict->matchState).window.nextSrc = (BYTE *)0x0;
  (cdict->matchState).window.base = (BYTE *)0x0;
  (cdict->matchState).window.dictBase = (BYTE *)0x0;
  (cdict->matchState).window.dictLimit = 0;
  (cdict->matchState).window.lowLimit = 0;
  (cdict->matchState).loadedDictEnd = 0;
  (cdict->matchState).nextToUpdate = 1;
  (cdict->matchState).opt.litLengthSum = 0;
  memset(pUVar4,0,(lVar6 + lVar5) * 4 + 4);
  (cdict->matchState).hashTable = pUVar4;
  pUVar4 = (U32 *)((long)pvVar3 + lVar6 * 4 + 0x1800);
  (cdict->matchState).chainTable = pUVar4;
  (cdict->matchState).hashTable3 = pUVar4 + lVar5;
  local_a8.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_a8.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_a8.ldmParams.minMatchLength = 0;
  local_a8.ldmParams.hashEveryLog = 0;
  local_a8.ldmParams.windowLog = 0;
  local_a8._92_4_ = 0;
  local_a8.overlapSizeLog = 0;
  local_a8.ldmParams.enableLdm = 0;
  local_a8.ldmParams.hashLog = 0;
  local_a8.ldmParams.bucketSizeLog = 0;
  local_a8.disableLiteralCompression = 0;
  local_a8.forceWindow = 0;
  local_a8.nbWorkers = 0;
  local_a8.jobSize = 0;
  local_a8.format = ZSTD_f_zstd1;
  local_a8.customMem.opaque = (void *)0x0;
  local_a8.fParams.noDictIDFlag = 0;
  local_a8.compressionLevel = 3;
  local_a8.fParams.contentSizeFlag = 1;
  local_a8.fParams.checksumFlag = 0;
  local_a8.cParams.windowLog = cParams.windowLog;
  local_a8.cParams.chainLog = cParams.chainLog;
  local_a8.cParams.hashLog = cParams.hashLog;
  local_a8.cParams.searchLog = cParams.searchLog;
  local_a8.cParams.searchLength = cParams.searchLength;
  local_a8.cParams._20_8_ = uVar1;
  code = ZSTD_compress_insertDictionary
                   (&cdict->cBlockState,&cdict->matchState,&local_a8,cdict->dictContent,
                    cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,cdict->workspace);
  uVar2 = ZSTD_isError(code);
  if (uVar2 == 0) {
    cdict->dictID = (U32)code;
    code = 0;
  }
  return code;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (U32)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictBuffer = NULL;
        cdict->dictContent = dictBuffer;
    } else {
        void* const internalBuffer = ZSTD_malloc(dictSize, cdict->customMem);
        cdict->dictBuffer = internalBuffer;
        cdict->dictContent = internalBuffer;
        if (!internalBuffer) return ERROR(memory_allocation);
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    {   void* const end = ZSTD_reset_matchState(
                &cdict->matchState,
                (U32*)cdict->workspace + HUF_WORKSPACE_SIZE_U32,
                &cParams, ZSTDcrp_continue, /* forCCtx */ 0);
        assert(end == (char*)cdict->workspace + cdict->workspaceSize);
        (void)end;
    }
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is <= 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, &params,
                    cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->workspace);
            if (ZSTD_isError(dictID)) return dictID;
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}